

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_kernel.cc
# Opt level: O0

void __thiscall ipx::BasicLuHelper::BasicLuHelper(BasicLuHelper *this,Int dim)

{
  lu_int lVar1;
  undefined8 uVar2;
  logic_error *this_00;
  Int err;
  bad_alloc *in_stack_ffffffffffffffd0;
  basiclu_object *in_stack_ffffffffffffffd8;
  
  lVar1 = basiclu_obj_initialize
                    (in_stack_ffffffffffffffd8,(lu_int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  if (lVar1 == -9) {
    uVar2 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffffd0);
    __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (lVar1 != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"basiclu_obj_initialize failed");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

BasicLuHelper(Int dim) {
        Int err = basiclu_obj_initialize(&obj, dim);
        if (err == BASICLU_ERROR_out_of_memory)
            throw std::bad_alloc();
        if (err != BASICLU_OK)
            throw std::logic_error("basiclu_obj_initialize failed");
    }